

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void flatbuffers::anon_unknown_96::CopyInline
               (FlatBufferBuilder *fbb,Field *fielddef,Table *table,size_t align,size_t size)

{
  uint16_t uVar1;
  SizeT off;
  uchar *bytes;
  size_t size_local;
  size_t align_local;
  Table *table_local;
  Field *fielddef_local;
  FlatBufferBuilder *fbb_local;
  
  FlatBufferBuilderImpl<false>::Align(fbb,align);
  uVar1 = reflection::Field::offset(fielddef);
  bytes = Table::GetStruct<unsigned_char_const*>(table,uVar1);
  FlatBufferBuilderImpl<false>::PushBytes(fbb,bytes,size);
  uVar1 = reflection::Field::offset(fielddef);
  off = FlatBufferBuilderImpl<false>::GetSize(fbb);
  FlatBufferBuilderImpl<false>::TrackField(fbb,uVar1,off);
  return;
}

Assistant:

static void CopyInline(FlatBufferBuilder &fbb,
                       const reflection::Field &fielddef, const Table &table,
                       size_t align, size_t size) {
  fbb.Align(align);
  fbb.PushBytes(table.GetStruct<const uint8_t *>(fielddef.offset()), size);
  fbb.TrackField(fielddef.offset(), fbb.GetSize());
}